

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::initiatorFixtureTagAppearsMoreThanOnce_RejectedHelper::
initiatorFixtureTagAppearsMoreThanOnce_RejectedHelper
          (initiatorFixtureTagAppearsMoreThanOnce_RejectedHelper *this,TestDetails *details)

{
  initiatorFixture::initiatorFixture(&this->super_initiatorFixture);
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.super_Responder.
  _vptr_Responder = (_func_int **)&PTR__sessionFixture_003294d8;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.super_NullApplication.
  super_Application._vptr_Application =
       (_func_int **)&PTR__initiatorFixtureTagAppearsMoreThanOnce_RejectedHelper_00329530;
  this->m_details = details;
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, TagAppearsMoreThanOnce_Rejected)
{
  startLoggedOn();

  FIX42::NewOrderSingle newOrderSingle = createNewOrderSingle( "ISLD", "TW", 2 );
  newOrderSingle.setField(Symbol("1stAppearance"));
  newOrderSingle.setField(Symbol("2ndAppearance"), false);

  object->next( newOrderSingle, UtcTimeStamp() );
  CHECK_EQUAL(1, toReject);
}